

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparspak.cpp
# Opt level: O3

int mmdnum_(int *neqns,int *perm,int *invp,int *qsize)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  
  iVar1 = *neqns;
  if (0 < iVar1) {
    lVar5 = 0;
    do {
      iVar7 = -invp[lVar5];
      if (qsize[lVar5] < 1) {
        iVar7 = invp[lVar5];
      }
      perm[lVar5] = iVar7;
      lVar5 = lVar5 + 1;
    } while ((int)lVar5 < iVar1);
  }
  iVar1 = *neqns;
  if (0 < iVar1) {
    iVar7 = 1;
    do {
      iVar8 = iVar7;
      if (perm[(long)iVar7 + -1] < 1) {
        do {
          iVar4 = iVar8;
          uVar2 = perm[(long)iVar4 + -1];
          iVar8 = -uVar2;
        } while ((int)uVar2 < 1);
        invp[(long)iVar7 + -1] = ~uVar2;
        perm[(long)iVar4 + -1] = uVar2 + 1;
        iVar8 = perm[(long)iVar7 + -1];
        if (iVar8 < 0) {
          piVar6 = perm + (long)iVar7 + -1;
          do {
            *piVar6 = -iVar4;
            piVar6 = perm + ((ulong)(uint)-iVar8 - 1);
            iVar8 = *piVar6;
          } while (iVar8 < 0);
        }
      }
      bVar3 = iVar7 < iVar1;
      iVar7 = iVar7 + 1;
    } while (bVar3);
  }
  iVar1 = *neqns;
  if (0 < iVar1) {
    lVar5 = 0;
    do {
      iVar7 = invp[lVar5];
      invp[lVar5] = -iVar7;
      lVar5 = lVar5 + 1;
      perm[-1 - (long)iVar7] = (int)lVar5;
    } while ((int)lVar5 < iVar1);
  }
  return 0;
}

Assistant:

int mmdnum_(int* neqns, int* perm, int* invp, int* qsize)
{
    /* System generated locals */
    int i__1;

    /* Local variables */
    static int node, root, nextf, father, nqsize, num;


/* *************************************************************** */

/*         INTEGER*2  INVP(1)  , PERM(1)  , QSIZE(1) */

/* *************************************************************** */

    /* Parameter adjustments */
    --qsize; --invp; --perm;

    /* Function Body */
    i__1 = *neqns;
    for (node = 1; node <= i__1; ++node) {
        nqsize = qsize[node];
        if (nqsize <= 0) {
            perm[node] = invp[node];
        }
        if (nqsize > 0) {
            perm[node] = -invp[node];
        }
/* L100: */
    }
/*        ------------------------------------------------------ */
/*        FOR EACH NODE WHICH HAS BEEN MERGED, DO THE FOLLOWING. */
/*        ------------------------------------------------------ */
    i__1 = *neqns;
    for (node = 1; node <= i__1; ++node) {
        if (perm[node] > 0) {
            goto L500;
        }
/*                ----------------------------------------- */
/*                TRACE THE MERGED TREE UNTIL ONE WHICH HAS */
/*                NOT BEEN MERGED, CALL IT ROOT. */
/*                ----------------------------------------- */
        father = node;
L200:
        if (perm[father] > 0) {
            goto L300;
        }
        father = -perm[father];
        goto L200;
L300:
/*                ----------------------- */
/*                NUMBER NODE AFTER ROOT. */
/*                ----------------------- */
        root = father;
        num = perm[root] + 1;
        invp[node] = -num;
        perm[root] = num;
/*                ------------------------ */
/*                SHORTEN THE MERGED TREE. */
/*                ------------------------ */
        father = node;
L400:
        nextf = -perm[father];
        if (nextf <= 0) {
            goto L500;
        }
        perm[father] = -root;
        father = nextf;
        goto L400;
L500:
        ;
    }
/*        ---------------------- */
/*        READY TO COMPUTE PERM. */
/*        ---------------------- */
    i__1 = *neqns;
    for (node = 1; node <= i__1; ++node) {
        num = -invp[node];
        invp[node] = num;
        perm[num] = node;
/* L600: */
    }
    return 0;

}